

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O3

void genericCS16toCU8(void *srcBuff,void *dstBuff,size_t numElems,double scaler)

{
  long lVar1;
  
  if (numElems * 2 != 0) {
    lVar1 = 0;
    do {
      *(char *)((long)dstBuff + lVar1) =
           (char)((uint)(int)((double)(int)*(short *)((long)srcBuff + lVar1 * 2) * scaler) >> 8) +
           -0x80;
      lVar1 = lVar1 + 1;
    } while (numElems * 2 != lVar1);
  }
  return;
}

Assistant:

static void genericCS16toCU8(const void *srcBuff, void *dstBuff, const size_t numElems, const double scaler)
{
  const size_t elemDepth = 2;

  auto *src = (int16_t*)srcBuff;
  auto *dst = (uint8_t*)dstBuff;
  for (size_t i = 0; i < numElems*elemDepth; i++)
    {
      dst[i] = SoapySDR::S16toU8(src[i] * scaler);
    }
}